

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::CopyProducerPageIntoLogBuffer
          (TracingServiceImpl *this,ProducerID producer_id_trusted,uid_t producer_uid_trusted,
          pid_t producer_pid_trusted,WriterID writer_id,ChunkID chunk_id,BufferID buffer_id,
          uint16_t num_fragments,uint8_t chunk_flags,bool chunk_complete,uint8_t *src,size_t size)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  _Base_ptr *pp_Var3;
  _Base_ptr p_Var4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr *pp_Var10;
  _Base_ptr p_Var11;
  bool bVar12;
  
  p_Var8 = (this->producers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var1 = &(this->producers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      bVar12 = (ushort)(short)p_Var8[1]._M_color < producer_id_trusted;
      if (!bVar12) {
        p_Var4 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[bVar12];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((((_Rb_tree_header *)p_Var4 != p_Var1) &&
         ((ushort)(short)p_Var4[1]._M_color <= producer_id_trusted)) &&
        (p_Var8 = p_Var4[1]._M_parent, p_Var8 != (_Base_ptr)0x0)) &&
       (p_Var4 = (this->buffers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
       p_Var4 != (_Base_ptr)0x0)) {
      p_Var1 = &(this->buffers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var1->_M_header;
      do {
        bVar12 = (ushort)(short)p_Var4[1]._M_color < buffer_id;
        if (!bVar12) {
          p_Var9 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar12];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var9 != p_Var1) && ((ushort)(short)p_Var9[1]._M_color <= buffer_id)
          ) && ((TraceBuffer *)p_Var9[1]._M_parent != (TraceBuffer *)0x0)) {
        pp_Var3 = *(_Base_ptr **)(p_Var8 + 7);
        if (pp_Var3 != (_Base_ptr *)0x0) {
          pp_Var10 = &p_Var8[6]._M_right;
          do {
            if (*(ushort *)(pp_Var3 + 4) >= buffer_id) {
              pp_Var10 = pp_Var3;
            }
            pp_Var3 = (_Base_ptr *)pp_Var3[(ulong)(*(ushort *)(pp_Var3 + 4) < buffer_id) + 2];
          } while (pp_Var3 != (_Base_ptr *)0x0);
          if ((pp_Var10 != &p_Var8[6]._M_right) && (*(ushort *)(pp_Var10 + 4) <= buffer_id)) {
            p_Var4 = p_Var8[8]._M_left;
            if (p_Var4 != (_Base_ptr)0x0) {
              p_Var11 = (_Base_ptr)&p_Var8[8]._M_parent;
              do {
                bVar12 = (ushort)(short)p_Var4[1]._M_color < writer_id;
                if (!bVar12) {
                  p_Var11 = p_Var4;
                }
                p_Var4 = (&p_Var4->_M_left)[bVar12];
              } while (p_Var4 != (_Base_ptr)0x0);
              if (((p_Var11 != (_Base_ptr)&p_Var8[8]._M_parent) &&
                  ((ushort)(short)p_Var11[1]._M_color <= writer_id)) &&
                 (uVar2 = *(undefined2 *)((long)&p_Var11[1]._M_color + 2), uVar2 != buffer_id)) {
                pcVar5 = "/";
                do {
                  pcVar7 = pcVar5 + 2;
                  pcVar5 = pcVar5 + 1;
                } while (*pcVar7 != '\0');
                pcVar7 = "";
                do {
                  pcVar6 = pcVar7 + 1;
                  pcVar7 = pcVar7 + 1;
                } while (*pcVar6 != '\0');
                do {
                  pcVar6 = pcVar5;
                  if (pcVar6 + 1 <
                      "workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     ) break;
                  pcVar5 = pcVar6 + -1;
                } while ((pcVar7 <= pcVar6) || (*pcVar6 != '/'));
                base::LogMessage(kLogError,pcVar6 + 1,0xe5d9,
                                 "Writer %u of producer %u was registered to write into target buffer %u, but tried to write into buffer %u"
                                 ,writer_id,(ulong)producer_id_trusted,(ulong)(ushort)uVar2,
                                 (ulong)buffer_id);
                goto LAB_002b77e8;
              }
            }
            TraceBuffer::CopyChunkUntrusted
                      ((TraceBuffer *)p_Var9[1]._M_parent,producer_id_trusted,producer_uid_trusted,
                       producer_pid_trusted,writer_id,chunk_id,num_fragments,chunk_flags,
                       chunk_complete,src,size);
            return;
          }
        }
        pcVar5 = "/";
        do {
          pcVar7 = pcVar5 + 2;
          pcVar5 = pcVar5 + 1;
        } while (*pcVar7 != '\0');
        pcVar7 = "";
        do {
          pcVar6 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
        } while (*pcVar6 != '\0');
        do {
          pcVar6 = pcVar5;
          if (pcVar6 + 1 <
              "workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
             ) break;
          pcVar5 = pcVar6 + -1;
        } while ((pcVar7 <= pcVar6) || (*pcVar6 != '/'));
        base::LogMessage(kLogError,pcVar6 + 1,0xe5ca,
                         "Producer %u tried to write into forbidden target buffer %u",
                         (ulong)producer_id_trusted,(ulong)buffer_id);
      }
    }
  }
LAB_002b77e8:
  this->chunks_discarded_ = this->chunks_discarded_ + 1;
  return;
}

Assistant:

void TracingServiceImpl::CopyProducerPageIntoLogBuffer(
    ProducerID producer_id_trusted,
    uid_t producer_uid_trusted,
    pid_t producer_pid_trusted,
    WriterID writer_id,
    ChunkID chunk_id,
    BufferID buffer_id,
    uint16_t num_fragments,
    uint8_t chunk_flags,
    bool chunk_complete,
    const uint8_t* src,
    size_t size) {
  PERFETTO_DCHECK_THREAD(thread_checker_);

  ProducerEndpointImpl* producer = GetProducer(producer_id_trusted);
  if (!producer) {
    PERFETTO_DFATAL("Producer not found.");
    chunks_discarded_++;
    return;
  }

  TraceBuffer* buf = GetBufferByID(buffer_id);
  if (!buf) {
    PERFETTO_DLOG("Could not find target buffer %" PRIu16
                  " for producer %" PRIu16,
                  buffer_id, producer_id_trusted);
    chunks_discarded_++;
    return;
  }

  // Verify that the producer is actually allowed to write into the target
  // buffer specified in the request. This prevents a malicious producer from
  // injecting data into a log buffer that belongs to a tracing session the
  // producer is not part of.
  if (!producer->is_allowed_target_buffer(buffer_id)) {
    PERFETTO_ELOG("Producer %" PRIu16
                  " tried to write into forbidden target buffer %" PRIu16,
                  producer_id_trusted, buffer_id);
    PERFETTO_DFATAL("Forbidden target buffer");
    chunks_discarded_++;
    return;
  }

  // If the writer was registered by the producer, it should only write into the
  // buffer it was registered with.
  base::Optional<BufferID> associated_buffer =
      producer->buffer_id_for_writer(writer_id);
  if (associated_buffer && *associated_buffer != buffer_id) {
    PERFETTO_ELOG("Writer %" PRIu16 " of producer %" PRIu16
                  " was registered to write into target buffer %" PRIu16
                  ", but tried to write into buffer %" PRIu16,
                  writer_id, producer_id_trusted, *associated_buffer,
                  buffer_id);
    PERFETTO_DFATAL("Wrong target buffer");
    chunks_discarded_++;
    return;
  }

  buf->CopyChunkUntrusted(producer_id_trusted, producer_uid_trusted,
                          producer_pid_trusted, writer_id, chunk_id,
                          num_fragments, chunk_flags, chunk_complete, src,
                          size);
}